

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext *ctx,TypeFunction *functionType)

{
  ulong uVar1;
  TypeHandle *pTVar2;
  TypeBase **ppTVar3;
  ArrayView<TypeBase_*> argumentTypes_00;
  SmallArray<TypeBase_*,_32U> argumentTypes;
  SmallArray<TypeBase_*,_32U> local_138;
  
  local_138.allocator = ctx->allocator;
  local_138.data = local_138.little;
  local_138.count = 0;
  local_138.max = 0x20;
  pTVar2 = (functionType->arguments).head;
  if (pTVar2 == (TypeHandle *)0x0) {
    ppTVar3 = &ctx->ctx->typeNullPtr;
  }
  else {
    do {
      if (local_138.count == local_138.max) {
        SmallArray<TypeBase_*,_32U>::grow(&local_138,local_138.count);
      }
      if (local_138.data == (TypeBase **)0x0) goto LAB_0017ea41;
      uVar1 = (ulong)local_138.count;
      local_138.count = local_138.count + 1;
      local_138.data[uVar1] = pTVar2->type;
      pTVar2 = pTVar2->next;
    } while (pTVar2 != (TypeHandle *)0x0);
    ppTVar3 = &ctx->ctx->typeNullPtr;
    if (local_138.count == local_138.max) {
      SmallArray<TypeBase_*,_32U>::grow(&local_138,local_138.max);
    }
  }
  if (local_138.data != (TypeBase **)0x0) {
    uVar1 = (ulong)local_138.count;
    argumentTypes_00.count = local_138.count + 1;
    local_138.count = argumentTypes_00.count;
    local_138.data[uVar1] = *ppTVar3;
    argumentTypes_00.data = local_138.data;
    argumentTypes_00._12_4_ = 0;
    CompileLlvmFunctionType(ctx,functionType->returnType,argumentTypes_00);
    SmallArray<TypeBase_*,_32U>::~SmallArray(&local_138);
    return (LLVMTypeRef)&placeholderType;
  }
LAB_0017ea41:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<TypeBase *, 32>::push_back(const T &) [T = TypeBase *, N = 32]");
}

Assistant:

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext &ctx, TypeFunction *functionType)
{
	SmallArray<TypeBase*, 32> argumentTypes(ctx.allocator);

	for(TypeHandle *curr = functionType->arguments.head; curr; curr = curr->next)
		argumentTypes.push_back(curr->type);

	argumentTypes.push_back(ctx.ctx.typeNullPtr);

	return CompileLlvmFunctionType(ctx, functionType->returnType, argumentTypes);
}